

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstant
          (Parser *this,EnumValueDescriptorProto *enum_value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  int32_t local_74;
  undefined1 local_70 [4];
  int number;
  LocationRecorder location_1;
  undefined1 local_48 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *enum_value_location_local;
  EnumValueDescriptorProto *enum_value_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  LocationRecorder::LocationRecorder((LocationRecorder *)local_48,enum_value_location,1);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_48,&enum_value->super_Message,NAME);
  output = EnumValueDescriptorProto::mutable_name_abi_cxx11_(enum_value);
  bVar1 = ConsumeIdentifier(this,output,"Expected enum constant name.");
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  location_1.location_._1_3_ = 0;
  location_1.location_._0_1_ = !bVar1;
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_48);
  if ((uint)location_1.location_ == 0) {
    bVar1 = Consume(this,"=","Missing numeric value for enum constant.");
    if (bVar1) {
      LocationRecorder::LocationRecorder((LocationRecorder *)local_70,enum_value_location,2);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)local_70,&enum_value->super_Message,NUMBER);
      bVar1 = ConsumeSignedInteger(this,&local_74,"Expected integer.");
      if (bVar1) {
        EnumValueDescriptorProto::set_number(enum_value,local_74);
      }
      else {
        this_local._7_1_ = 0;
      }
      location_1.location_._1_3_ = 0;
      location_1.location_._0_1_ = !bVar1;
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_70);
      if ((uint)location_1.location_ == 0) {
        bVar1 = ParseEnumConstantOptions
                          (this,enum_value,enum_value_location,
                           (FileDescriptorProto *)location.location_);
        if (bVar1) {
          bVar1 = ConsumeEndOfDeclaration(this,";",enum_value_location);
          if (bVar1) {
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseEnumConstant(EnumValueDescriptorProto* enum_value,
                               const LocationRecorder& enum_value_location,
                               const FileDescriptorProto* containing_file) {
  // Parse name.
  {
    LocationRecorder location(enum_value_location,
                              EnumValueDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(enum_value,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(enum_value->mutable_name(),
                         "Expected enum constant name."));
  }

  DO(Consume("=", "Missing numeric value for enum constant."));

  // Parse value.
  {
    LocationRecorder location(enum_value_location,
                              EnumValueDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(enum_value,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int number;
    DO(ConsumeSignedInteger(&number, "Expected integer."));
    enum_value->set_number(number);
  }

  DO(ParseEnumConstantOptions(enum_value, enum_value_location,
                              containing_file));

  DO(ConsumeEndOfDeclaration(";", &enum_value_location));

  return true;
}